

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

void __thiscall
axl::sl::
OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
::clear(OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
        *this)

{
  ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
  *in_RDI;
  SerialPortDesc *p;
  ListLink *link;
  SerialPortDesc *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffe0;
  ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink> local_11;
  ListLink *local_10;
  
  if (*(long *)in_RDI != 0) {
    local_10 = ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>::operator()
                         (&local_11,*(SerialPortDesc **)in_RDI);
    while (local_10 != (ListLink *)0x0) {
      in_stack_ffffffffffffffe0 =
           IteratorBase<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
           ::getEntryFromLink(&in_stack_ffffffffffffffe0->super_ListLink);
      local_10 = ListLink::getNext(local_10);
      mem::Delete<axl::io::SerialPortDesc>::operator()
                ((Delete<axl::io::SerialPortDesc> *)in_RDI,in_stack_ffffffffffffffc8);
    }
    ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
    ::construct(in_RDI);
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}